

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O0

void sptk::swipe::La(matrix L,vector f,vector fERBs,RealValuedFastFourierTransform *plan,
                    vector<double,_std::allocator<double>_> *fi,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *fo,Buffer *buffer,int w2,int hi,int i)

{
  vector yr_vector;
  vector yr_vector_00;
  vector x;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  double *in_RCX;
  uint in_EDX;
  double *pdVar8;
  long in_RSI;
  undefined8 in_RDI;
  double *in_R9;
  double dVar9;
  vector vVar10;
  vector x_00;
  vector x_01;
  vector y;
  vector y_00;
  vector y2;
  vector y2_00;
  vector yr_vector_01;
  double *in_stack_00000008;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000018;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  vector a2;
  vector a;
  double *fo1;
  double *fo0;
  int j;
  int iVar11;
  undefined4 in_stack_fffffffffffffecc;
  undefined8 in_stack_fffffffffffffee8;
  double *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  double *in_stack_ffffffffffffff00;
  Buffer *in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_34;
  int iStack_c;
  double *pdVar7;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator[](in_stack_00000018,0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator[](in_stack_00000018,1);
  bVar1 = RealValuedFastFourierTransform::Run
                    ((RealValuedFastFourierTransform *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     in_stack_ffffffffffffffa0,
                     (vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](in_stack_00000018,0);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](in_stack_00000018,1);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
    vVar10 = makev(0);
    pdVar7 = vVar10.v;
    uVar2 = vVar10.x;
    for (local_34 = 0; local_34 < in_stack_00000028; local_34 = local_34 + 1) {
      dVar9 = sqrt(pvVar5[local_34] * pvVar5[local_34] + pvVar6[local_34] * pvVar6[local_34]);
      pdVar7[local_34] = dVar9;
    }
    x.v = in_stack_ffffffffffffff00;
    x._0_8_ = in_stack_fffffffffffffef8;
    vVar10.v = in_stack_fffffffffffffef0;
    vVar10._0_8_ = in_stack_fffffffffffffee8;
    vVar10 = spline(x,vVar10);
    pdVar8 = vVar10.v;
    uVar3 = vVar10.x;
    x_00._4_4_ = 0;
    x_00.x = in_EDX;
    y._4_4_ = 0;
    y.x = uVar2;
    y2._4_4_ = 0;
    y2.x = uVar3;
    x_00.v = in_RCX;
    y.v = pdVar7;
    y2.v = pdVar8;
    iVar11 = in_stack_00000030;
    dVar9 = splinv(x_00,y,y2,*in_R9,in_stack_00000030);
    sqrt(dVar9);
    dVar9 = fixnan((double)in_stack_00000008);
    **(double **)(in_RSI + (long)in_stack_00000038 * 8) = dVar9;
    for (local_34 = 1; iStack_c = (int)((ulong)in_RDI >> 0x20), local_34 < iStack_c;
        local_34 = local_34 + 1) {
      yr_vector_01.v._0_4_ = in_stack_00000030;
      yr_vector_01._0_8_ = in_RCX;
      yr_vector_01.v._4_4_ = 0;
      in_stack_00000030 = bilookv((swipe *)(ulong)in_EDX,yr_vector_01,in_R9[local_34],local_34);
      x_01._4_4_ = 0;
      x_01.x = in_EDX;
      y_00._4_4_ = 0;
      y_00.x = uVar2;
      y2_00._4_4_ = 0;
      y2_00.x = uVar3;
      x_01.v = in_RCX;
      y_00.v = pdVar7;
      y2_00.v = pdVar8;
      iVar11 = in_stack_00000030;
      dVar9 = splinv(x_01,y_00,y2_00,in_R9[local_34],in_stack_00000030);
      sqrt(dVar9);
      dVar9 = fixnan((double)in_stack_00000008);
      *(double *)(*(long *)(in_RSI + (long)in_stack_00000038 * 8) + (long)local_34 * 8) = dVar9;
    }
    yr_vector._4_4_ = in_stack_fffffffffffffecc;
    yr_vector.x = iVar11;
    yr_vector.v = in_stack_00000008;
    freev(yr_vector);
    yr_vector_00._4_4_ = in_stack_fffffffffffffecc;
    yr_vector_00.x = iVar11;
    yr_vector_00.v = in_stack_00000008;
    freev(yr_vector_00);
  }
  return;
}

Assistant:

void La(matrix L, vector f, vector fERBs,
                  const sptk::RealValuedFastFourierTransform& plan,
                  const std::vector<double>& fi,
                  std::vector<std::vector<double> >* fo,
                  sptk::RealValuedFastFourierTransform::Buffer* buffer,
                  int w2, int hi, int i) {
    int j;
    if (!plan.Run(fi, &((*fo)[0]), &((*fo)[1]), buffer))
        return;
    double* fo0 = &(((*fo)[0])[0]);
    double* fo1 = &(((*fo)[1])[0]);
    vector a = makev(w2);
    for (j = 0; j < w2; j++) // this iterates over only the first half
        a.v[j] = sqrt(fo0[j] * fo0[j] + fo1[j] * fo1[j]);
#endif
    vector a2 = spline(f, a); // a2 is now the result of the cubic spline
    L.m[i][0] = fixnan(sqrt(splinv(f, a, a2, fERBs.v[0], hi)));
    for (j = 1; j < L.y; j++) { // perform a bisection query at ERB intvls
        hi = bilookv(f, fERBs.v[j], hi); 
        L.m[i][j] = fixnan(sqrt(splinv(f, a, a2, fERBs.v[j], hi)));
    }
    freev(a); 
    freev(a2);
}